

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

string * embree::to_string_abi_cxx11_(RTCFeatureFlags features)

{
  bool bVar1;
  uint in_ESI;
  string *in_RDI;
  string out;
  char *in_stack_ffffffffffffff88;
  allocator *paVar2;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  allocator local_45 [20];
  allocator local_31;
  string local_30 [36];
  uint local_c;
  
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if ((local_c & 1) != 0) {
    std::__cxx11::string::operator+=(local_30,"MOTION_BLUR");
  }
  if ((local_c & 2) != 0) {
    std::__cxx11::string::operator+=(local_30,"TRIANGLE ");
  }
  if ((local_c & 4) != 0) {
    std::__cxx11::string::operator+=(local_30,"QUAD ");
  }
  if ((local_c & 8) != 0) {
    std::__cxx11::string::operator+=(local_30,"GRID ");
  }
  if ((local_c & 0x10) != 0) {
    std::__cxx11::string::operator+=(local_30,"SUBDIVISION ");
  }
  if ((local_c & 0x20) != 0) {
    std::__cxx11::string::operator+=(local_30,"CONE_LINEAR_CURVE ");
  }
  if ((local_c & 0x40) != 0) {
    std::__cxx11::string::operator+=(local_30,"ROUND_LINEAR_CURVE ");
  }
  if ((local_c & 0x80) != 0) {
    std::__cxx11::string::operator+=(local_30,"FLAT_LINEAR_CURVE ");
  }
  if ((local_c & 0x100) != 0) {
    std::__cxx11::string::operator+=(local_30,"ROUND_BEZIER_CURVE ");
  }
  if ((local_c & 0x200) != 0) {
    std::__cxx11::string::operator+=(local_30,"FLAT_BEZIER_CURVE ");
  }
  if ((local_c & 0x400) != 0) {
    std::__cxx11::string::operator+=(local_30,"NORMAL_ORIENTED_BEZIER_CURVE ");
  }
  if ((local_c & 0x800) != 0) {
    std::__cxx11::string::operator+=(local_30,"ROUND_BSPLINE_CURVE ");
  }
  if ((local_c & 0x1000) != 0) {
    std::__cxx11::string::operator+=(local_30,"FLAT_BSPLINE_CURVE ");
  }
  if ((local_c & 0x2000) != 0) {
    std::__cxx11::string::operator+=(local_30,"NORMAL_ORIENTED_BSPLINE_CURVE ");
  }
  if ((local_c & 0x4000) != 0) {
    std::__cxx11::string::operator+=(local_30,"ROUND_HERMITE_CURVE ");
  }
  if ((local_c & 0x8000) != 0) {
    std::__cxx11::string::operator+=(local_30,"FLAT_HERMITE_CURVE ");
  }
  if ((local_c & 0x10000) != 0) {
    std::__cxx11::string::operator+=(local_30,"NORMAL_ORIENTED_HERMITE_CURVE ");
  }
  if ((local_c & 0x20000) != 0) {
    std::__cxx11::string::operator+=(local_30,"ROUND_CATMULL_ROM_CURVE ");
  }
  if ((local_c & 0x40000) != 0) {
    std::__cxx11::string::operator+=(local_30,"FLAT_CATMULL_ROM_CURVE ");
  }
  if ((local_c & 0x80000) != 0) {
    std::__cxx11::string::operator+=(local_30,"NORMAL_ORIENTED_CATMULL_ROM_CURVE ");
  }
  if ((local_c & 0x100000) != 0) {
    std::__cxx11::string::operator+=(local_30,"SPHERE_POINT ");
  }
  if ((local_c & 0x200000) != 0) {
    std::__cxx11::string::operator+=(local_30,"DISC_POINT ");
  }
  if ((local_c & 0x400000) != 0) {
    std::__cxx11::string::operator+=(local_30,"ORIENTED_DISC_POINT ");
  }
  if ((local_c & 0x800000) != 0) {
    std::__cxx11::string::operator+=(local_30,"INSTANCE ");
  }
  if ((local_c & 0x20000000) != 0) {
    std::__cxx11::string::operator+=(local_30,"INSTANCE_ARRAY ");
  }
  if ((local_c & 0x1000000) != 0) {
    std::__cxx11::string::operator+=(local_30,"FILTER_FUNCTION_IN_ARGUMENTS ");
  }
  if ((local_c & 0x2000000) != 0) {
    std::__cxx11::string::operator+=(local_30,"FILTER_FUNCTION_IN_GEOMETRY ");
  }
  if ((local_c & 0x4000000) != 0) {
    std::__cxx11::string::operator+=(local_30,"USER_GEOMETRY_CALLBACK_IN_ARGUMENTS ");
  }
  if ((local_c & 0x8000000) != 0) {
    std::__cxx11::string::operator+=(local_30,"USER_GEOMETRY_CALLBACK_IN_GEOMETRY ");
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88);
  if (bVar1) {
    paVar2 = local_45;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"NONE",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)local_45);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,local_30);
  }
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string to_string(RTCFeatureFlags features)
  {
    std::string out = "";
    if (features & RTC_FEATURE_FLAG_MOTION_BLUR) out += "MOTION_BLUR";
    if (features & RTC_FEATURE_FLAG_TRIANGLE) out += "TRIANGLE ";
    if (features & RTC_FEATURE_FLAG_QUAD) out += "QUAD ";
    if (features & RTC_FEATURE_FLAG_GRID) out += "GRID ";
    if (features & RTC_FEATURE_FLAG_SUBDIVISION) out += "SUBDIVISION ";
    if (features & RTC_FEATURE_FLAG_CONE_LINEAR_CURVE) out += "CONE_LINEAR_CURVE ";
    if (features & RTC_FEATURE_FLAG_ROUND_LINEAR_CURVE ) out += "ROUND_LINEAR_CURVE ";
    if (features & RTC_FEATURE_FLAG_FLAT_LINEAR_CURVE) out += "FLAT_LINEAR_CURVE ";
    if (features & RTC_FEATURE_FLAG_ROUND_BEZIER_CURVE) out += "ROUND_BEZIER_CURVE ";
    if (features & RTC_FEATURE_FLAG_FLAT_BEZIER_CURVE) out += "FLAT_BEZIER_CURVE ";
    if (features & RTC_FEATURE_FLAG_NORMAL_ORIENTED_BEZIER_CURVE) out += "NORMAL_ORIENTED_BEZIER_CURVE ";
    if (features & RTC_FEATURE_FLAG_ROUND_BSPLINE_CURVE) out += "ROUND_BSPLINE_CURVE ";
    if (features & RTC_FEATURE_FLAG_FLAT_BSPLINE_CURVE) out += "FLAT_BSPLINE_CURVE ";
    if (features & RTC_FEATURE_FLAG_NORMAL_ORIENTED_BSPLINE_CURVE) out += "NORMAL_ORIENTED_BSPLINE_CURVE ";
    if (features & RTC_FEATURE_FLAG_ROUND_HERMITE_CURVE) out += "ROUND_HERMITE_CURVE ";
    if (features & RTC_FEATURE_FLAG_FLAT_HERMITE_CURVE) out += "FLAT_HERMITE_CURVE ";
    if (features & RTC_FEATURE_FLAG_NORMAL_ORIENTED_HERMITE_CURVE) out += "NORMAL_ORIENTED_HERMITE_CURVE ";
    if (features & RTC_FEATURE_FLAG_ROUND_CATMULL_ROM_CURVE) out += "ROUND_CATMULL_ROM_CURVE ";
    if (features & RTC_FEATURE_FLAG_FLAT_CATMULL_ROM_CURVE) out += "FLAT_CATMULL_ROM_CURVE ";
    if (features & RTC_FEATURE_FLAG_NORMAL_ORIENTED_CATMULL_ROM_CURVE) out += "NORMAL_ORIENTED_CATMULL_ROM_CURVE ";
    if (features & RTC_FEATURE_FLAG_SPHERE_POINT) out += "SPHERE_POINT ";
    if (features & RTC_FEATURE_FLAG_DISC_POINT) out += "DISC_POINT ";
    if (features & RTC_FEATURE_FLAG_ORIENTED_DISC_POINT) out += "ORIENTED_DISC_POINT ";
    if (features & RTC_FEATURE_FLAG_INSTANCE) out += "INSTANCE ";
    if (features & RTC_FEATURE_FLAG_INSTANCE_ARRAY) out += "INSTANCE_ARRAY ";
    if (features & RTC_FEATURE_FLAG_FILTER_FUNCTION_IN_ARGUMENTS) out += "FILTER_FUNCTION_IN_ARGUMENTS ";
    if (features & RTC_FEATURE_FLAG_FILTER_FUNCTION_IN_GEOMETRY) out += "FILTER_FUNCTION_IN_GEOMETRY ";
    if (features & RTC_FEATURE_FLAG_USER_GEOMETRY_CALLBACK_IN_ARGUMENTS) out += "USER_GEOMETRY_CALLBACK_IN_ARGUMENTS ";
    if (features & RTC_FEATURE_FLAG_USER_GEOMETRY_CALLBACK_IN_GEOMETRY) out += "USER_GEOMETRY_CALLBACK_IN_GEOMETRY ";
    if (out == "") return "NONE";
    return out;
  }